

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O0

void jpeg_idct_3x3(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                  JSAMPARRAY output_buf,JDIMENSION output_col)

{
  short sVar1;
  short sVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  JSAMPROW pJVar7;
  int local_98 [6];
  int workspace [9];
  int ctr;
  JSAMPLE *range_limit;
  JSAMPROW outptr;
  int *wsptr;
  ISLOW_MULT_TYPE *quantptr;
  JCOEFPTR inptr;
  JLONG tmp12;
  JLONG tmp10;
  JLONG tmp2;
  JLONG tmp0;
  JDIMENSION output_col_local;
  JSAMPARRAY output_buf_local;
  
  workspace._16_8_ = cinfo->sample_range_limit + 0x80;
  range_limit = (JSAMPLE *)compptr->dct_table;
  unique0x00004e80 = local_98;
  outptr = (JSAMPROW)coef_block;
  for (workspace[3] = 0; workspace[3] < 3; workspace[3] = workspace[3] + 1) {
    lVar4 = (long)((int)*(short *)outptr * (int)*(short *)range_limit) * 0x2000 + 0x400;
    lVar5 = (long)((int)*(short *)(outptr + 0x20) * (int)*(short *)(range_limit + 0x20));
    lVar6 = lVar4 + lVar5 * 0x16a1;
    sVar1 = *(short *)(outptr + 0x10);
    sVar2 = *(short *)(range_limit + 0x10);
    *stack0xffffffffffffffa0 = (int)(lVar6 + (long)((int)sVar1 * (int)sVar2) * 0x2731 >> 0xb);
    stack0xffffffffffffffa0[6] = (int)(lVar6 + (long)((int)sVar1 * (int)sVar2) * -0x2731 >> 0xb);
    stack0xffffffffffffffa0[3] = (int)(lVar4 + lVar5 * -0x16a1 + lVar5 * -0x16a1 >> 0xb);
    outptr = outptr + 2;
    range_limit = range_limit + 2;
    register0x00000000 = stack0xffffffffffffffa0 + 1;
  }
  unique0x00004e80 = local_98;
  for (workspace[3] = 0; workspace[3] < 3; workspace[3] = workspace[3] + 1) {
    pJVar7 = output_buf[workspace[3]] + output_col;
    lVar4 = ((long)*stack0xffffffffffffffa0 + 0x10) * 0x2000;
    lVar5 = (long)stack0xffffffffffffffa0[2];
    lVar6 = lVar4 + lVar5 * 0x16a1;
    iVar3 = stack0xffffffffffffffa0[1];
    *pJVar7 = *(JSAMPLE *)
               (workspace._16_8_ + (long)(int)((uint)(lVar6 + (long)iVar3 * 0x2731 >> 0x12) & 0x3ff)
               );
    pJVar7[2] = *(JSAMPLE *)
                 (workspace._16_8_ +
                 (long)(int)((uint)(lVar6 + (long)iVar3 * -0x2731 >> 0x12) & 0x3ff));
    pJVar7[1] = *(JSAMPLE *)
                 (workspace._16_8_ +
                 (long)(int)((uint)(lVar4 + lVar5 * -0x16a1 + lVar5 * -0x16a1 >> 0x12) & 0x3ff));
    register0x00000000 = stack0xffffffffffffffa0 + 3;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_3x3(j_decompress_ptr cinfo, jpeg_component_info *compptr,
              JCOEFPTR coef_block, JSAMPARRAY output_buf,
              JDIMENSION output_col)
{
  JLONG tmp0, tmp2, tmp10, tmp12;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE *quantptr;
  int *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[3 * 3];         /* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = 0; ctr < 3; ctr++, inptr++, quantptr++, wsptr++) {
    /* Even part */

    tmp0 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);
    tmp0 = LEFT_SHIFT(tmp0, CONST_BITS);
    /* Add fudge factor here for final descale. */
    tmp0 += ONE << (CONST_BITS - PASS1_BITS - 1);
    tmp2 = DEQUANTIZE(inptr[DCTSIZE * 2], quantptr[DCTSIZE * 2]);
    tmp12 = MULTIPLY(tmp2, FIX(0.707106781)); /* c2 */
    tmp10 = tmp0 + tmp12;
    tmp2 = tmp0 - tmp12 - tmp12;

    /* Odd part */

    tmp12 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1]);
    tmp0 = MULTIPLY(tmp12, FIX(1.224744871)); /* c1 */

    /* Final output stage */

    wsptr[3 * 0] = (int)RIGHT_SHIFT(tmp10 + tmp0, CONST_BITS - PASS1_BITS);
    wsptr[3 * 2] = (int)RIGHT_SHIFT(tmp10 - tmp0, CONST_BITS - PASS1_BITS);
    wsptr[3 * 1] = (int)RIGHT_SHIFT(tmp2, CONST_BITS - PASS1_BITS);
  }

  /* Pass 2: process 3 rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < 3; ctr++) {
    outptr = output_buf[ctr] + output_col;

    /* Even part */

    /* Add fudge factor here for final descale. */
    tmp0 = (JLONG)wsptr[0] + (ONE << (PASS1_BITS + 2));
    tmp0 = LEFT_SHIFT(tmp0, CONST_BITS);
    tmp2 = (JLONG)wsptr[2];
    tmp12 = MULTIPLY(tmp2, FIX(0.707106781)); /* c2 */
    tmp10 = tmp0 + tmp12;
    tmp2 = tmp0 - tmp12 - tmp12;

    /* Odd part */

    tmp12 = (JLONG)wsptr[1];
    tmp0 = MULTIPLY(tmp12, FIX(1.224744871)); /* c1 */

    /* Final output stage */

    outptr[0] = range_limit[(int)RIGHT_SHIFT(tmp10 + tmp0,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[2] = range_limit[(int)RIGHT_SHIFT(tmp10 - tmp0,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[1] = range_limit[(int)RIGHT_SHIFT(tmp2,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];

    wsptr += 3;         /* advance pointer to next row */
  }
}